

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.hpp
# Opt level: O0

ExprArgWriter __thiscall
mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_>::ExprWriter::OPutN
          (ExprWriter *this,int opcode,int nArgs,char *descr)

{
  uint in_ECX;
  uint in_EDX;
  undefined8 extraout_RDX;
  long *in_RSI;
  NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_> *in_RDI;
  undefined8 in_R8;
  ExprArgWriter EVar1;
  int n2write;
  uint local_24;
  
  TextFormatter::apr((TextFormatter *)*in_RSI,(File *)(*in_RSI + 0x138),"o%d\t#%s\n",(ulong)in_EDX,
                     in_R8);
  local_24 = in_ECX;
  if (in_EDX == 0x40) {
    local_24 = (int)in_ECX / 2;
  }
  TextFormatter::apr((TextFormatter *)*in_RSI,(File *)(*in_RSI + 0x138),"%d\n",(ulong)local_24);
  ExprArgWriter::ExprArgWriter
            ((ExprArgWriter *)in_RDI,
             (NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_> *)*in_RSI,in_ECX
            );
  EVar1._8_8_ = extraout_RDX;
  EVar1.nlw_ = in_RDI;
  return EVar1;
}

Assistant:

typename NLWriter2<Params>::ExprArgWriter
NLWriter2<Params>::ExprWriter::OPutN(
    int opcode, int nArgs, const char* descr) {
  nlw_.apr(nlw_.nm,
           "o%d\t#%s\n", opcode, descr);
  int n2write = nArgs;
  if (64 == opcode) {       // piecewise-linear
    assert(0 == n2write % 2);
    n2write /= 2;
  }
  nlw_.apr(nlw_.nm, "%d\n", n2write);
  return ExprArgWriter(nlw_, nArgs);
}